

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

void satoko_destroy(solver_t *s)

{
  vec_uint_t *pvVar1;
  uint *puVar2;
  cdb *__ptr;
  vec_wl_t *__ptr_00;
  watch_list *pwVar3;
  void *__ptr_01;
  vec_act_t *__ptr_02;
  sdbl_t *__ptr_03;
  heap_t *__ptr_04;
  vec_int_t *__ptr_05;
  int *__ptr_06;
  vec_char_t *pvVar4;
  char *pcVar5;
  b_queue_t *pbVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  pvVar1 = s->assumptions;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->final_conflict;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  __ptr = s->all_clauses;
  free(__ptr->data);
  free(__ptr);
  pvVar1 = s->originals;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->learnts;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  __ptr_00 = s->watches;
  uVar7 = __ptr_00->cap;
  if (uVar7 != 0) {
    lVar9 = 0x10;
    uVar8 = 0;
    do {
      pwVar3 = __ptr_00->watch_lists;
      __ptr_01 = *(void **)((long)&pwVar3->cap + lVar9);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
        *(undefined8 *)((long)&pwVar3->cap + lVar9) = 0;
        uVar7 = __ptr_00->cap;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x18;
    } while (uVar8 < uVar7);
  }
  free(__ptr_00->watch_lists);
  free(__ptr_00);
  __ptr_02 = s->activity;
  __ptr_03 = __ptr_02->data;
  if (__ptr_03 != (sdbl_t *)0x0) {
    free(__ptr_03);
  }
  free(__ptr_02);
  __ptr_04 = s->var_order;
  __ptr_05 = __ptr_04->indices;
  __ptr_06 = __ptr_05->data;
  if (__ptr_06 != (int *)0x0) {
    free(__ptr_06);
  }
  free(__ptr_05);
  pvVar1 = __ptr_04->data;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  free(__ptr_04);
  pvVar1 = s->levels;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->reasons;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar4 = s->assigns;
  pcVar5 = pvVar4->data;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  free(pvVar4);
  pvVar4 = s->polarity;
  pcVar5 = pvVar4->data;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  free(pvVar4);
  pvVar1 = s->trail;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->trail_lim;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pbVar6 = s->bq_lbd;
  free(pbVar6->data);
  free(pbVar6);
  pbVar6 = s->bq_trail;
  free(pbVar6->data);
  free(pbVar6);
  pvVar1 = s->temp_lits;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar4 = s->seen;
  pcVar5 = pvVar4->data;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  free(pvVar4);
  pvVar1 = s->tagged;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->stack;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->last_dlevel;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar1 = s->stamps;
  puVar2 = pvVar1->data;
  if (puVar2 != (uint *)0x0) {
    free(puVar2);
  }
  free(pvVar1);
  pvVar4 = s->marks;
  if (pvVar4 != (vec_char_t *)0x0) {
    if (pvVar4->data != (char *)0x0) {
      free(pvVar4->data);
    }
    free(pvVar4);
  }
  free(s);
  return;
}

Assistant:

void satoko_destroy(solver_t *s)
{
    vec_uint_free(s->assumptions);
    vec_uint_free(s->final_conflict);
    cdb_free(s->all_clauses);
    vec_uint_free(s->originals);
    vec_uint_free(s->learnts);
    vec_wl_free(s->watches);
    vec_act_free(s->activity);
    heap_free(s->var_order);
    vec_uint_free(s->levels);
    vec_uint_free(s->reasons);
    vec_char_free(s->assigns);
    vec_char_free(s->polarity);
    vec_uint_free(s->trail);
    vec_uint_free(s->trail_lim);
    b_queue_free(s->bq_lbd);
    b_queue_free(s->bq_trail);
    vec_uint_free(s->temp_lits);
    vec_char_free(s->seen);
    vec_uint_free(s->tagged);
    vec_uint_free(s->stack);
    vec_uint_free(s->last_dlevel);
    vec_uint_free(s->stamps);
    if (s->marks)
        vec_char_free(s->marks);
    satoko_free(s);
}